

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
::ComputeViolations(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
                    *this,SolCheck *chk)

{
  double violRel;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  char *nm;
  int iVar5;
  SolCheck *in_RSI;
  Violation viol_00;
  pair<bool,_double> pVar6;
  int index;
  pair<bool,_double> cr;
  Violation viol;
  int c_class;
  int i;
  ViolSummArray<3> *conviolarray;
  VarInfoStatic *x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *conviolmap;
  size_type in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  mapped_type *in_stack_ffffffffffffff28;
  Violation *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff40;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar7;
  Violation *local_a8;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50;
  double local_48;
  uint local_30;
  int local_2c;
  mapped_type *local_28;
  
  sVar3 = std::
          deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
          ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                  *)0x1df440);
  if (sVar3 != 0) {
    std::
    deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
    ::front((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
             *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    Container::GetCon((Container *)0x1df463);
    bVar1 = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::IsLogical();
    if (bVar1) {
      local_a8 = (Violation *)SolCheck::ConViolLog_abi_cxx11_(in_RSI);
    }
    else {
      local_a8 = (Violation *)SolCheck::ConViolAlg_abi_cxx11_(in_RSI);
    }
    SolCheck::x_ext(in_RSI);
    local_28 = (mapped_type *)0x0;
    sVar3 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
            ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                    *)0x1df4d3);
    local_2c = (int)sVar3;
    while (iVar5 = local_2c + -1, local_2c != 0) {
      pvVar4 = std::
               deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
               ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                             *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = Container::IsUnused(pvVar4);
      local_2c = iVar5;
      if (!bVar1) {
        local_30 = 0;
        pvVar4 = std::
                 deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        bVar1 = Container::IsBridged(pvVar4);
        if (!bVar1) {
          local_30 = 8;
        }
        pvVar4 = std::
                 deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        iVar5 = Container::GetDepth(pvVar4);
        if (iVar5 == 0) {
          local_30 = local_30 | 2;
        }
        if (local_30 == 0) {
          local_30 = 4;
        }
        uVar7 = local_30;
        uVar2 = SolCheck::check_mode(in_RSI);
        if ((uVar7 & uVar2) != 0) {
          std::
          deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
          ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                        *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          Container::GetCon((Container *)0x1df5f6);
          viol_00 = AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>::
                    ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                               CONCAT44(uVar7,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
                               SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
          in_stack_ffffffffffffff48 =
               (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
               SolCheck::GetFeasTol(in_RSI);
          SolCheck::GetFeasTolRel(in_RSI);
          pVar6 = Violation::Check(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28,
                                   (double)CONCAT44(in_stack_ffffffffffffff24,
                                                    in_stack_ffffffffffffff20));
          local_48 = pVar6.second;
          local_50 = pVar6.first;
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (local_28 == (mapped_type *)0x0) {
              in_stack_ffffffffffffff30 = local_a8;
              BasicConstraintKeeper::GetShortTypeName((BasicConstraintKeeper *)viol_00.viol_);
              in_stack_ffffffffffffff40 = &local_71;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(uVar7,in_stack_ffffffffffffff50),(char *)in_stack_ffffffffffffff48
                         ,in_stack_ffffffffffffff40);
              local_28 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                                       *)CONCAT44(uVar7,in_stack_ffffffffffffff50),
                                      (key_type *)in_stack_ffffffffffffff48);
              in_stack_ffffffffffffff28 = local_28;
              std::__cxx11::string::~string(local_70);
              std::allocator<char>::~allocator(&local_71);
            }
            if ((local_30 & 2) == 0) {
              in_stack_ffffffffffffff24 = 1;
              if ((local_30 & 8) != 0) {
                in_stack_ffffffffffffff24 = 2;
              }
            }
            else {
              in_stack_ffffffffffffff24 = 0;
            }
            in_stack_ffffffffffffff10 =
                 std::array<mp::ViolSummary,_3UL>::operator[]
                           ((array<mp::ViolSummary,_3UL> *)in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff08);
            violRel = local_48;
            std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
            ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                          *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            Container::GetCon((Container *)0x1df7e1);
            nm = BasicConstraint::name((BasicConstraint *)0x1df7e9);
            ViolSummary::CountViol(in_stack_ffffffffffffff10,viol_00,violRel,nm);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ComputeViolations(SolCheck& chk) override {
    if (cons_.size()) {
      auto& conviolmap =
          cons_.front().GetCon().IsLogical() ?
            chk.ConViolLog() :
            chk.ConViolAlg();
      const auto& x = chk.x_ext();
      ViolSummArray<3>* conviolarray {nullptr};
      for (int i=(int)cons_.size(); i--; ) {
        if (!cons_[i].IsUnused()) {
          int c_class = 0;    // class of this constraint
          if (!cons_[i].IsBridged())
            c_class |= 8;     // solver-side constraint
          if (!cons_[i].GetDepth())
            c_class |= 2;     // top-level
          if (!c_class)
            c_class = 4;      // intermediate
          if (c_class & chk.check_mode()) {
            auto viol = cons_[i].GetCon().ComputeViolation(x);
            auto cr = viol.Check(
                  chk.GetFeasTol(), chk.GetFeasTolRel());
            if (cr.first) {
              if (!conviolarray)
                conviolarray =         // lazy map access
                    &conviolmap[GetShortTypeName()];
              /// index==0,1,2: original, interm, solver-side
              /// If both orig and solver, report as orig
              int index = (c_class & 2) ? 0
                                        : (c_class & 8)
                                          ? 2 : 1;
              assert(index < (int)conviolarray->size());
              (*conviolarray)[index].CountViol(
                    viol, cr.second, cons_[i].GetCon().name());
            }
          }
        }
      }
    }
  }